

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

void __thiscall FxConstant::FxConstant(FxConstant *this,bool val,FScriptPosition *pos)

{
  PBool *pPVar1;
  undefined7 in_register_00000031;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00707480;
  pPVar1 = TypeBool;
  (this->value).Type = (PType *)TypeBool;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  (this->value).field_1.Int = (int)CONCAT71(in_register_00000031,val);
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(bool val, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = TypeBool;
		value.Int = val;
		isresolved = true;
	}